

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UnsynchedPipe.h
# Opt level: O0

void __thiscall
teetime::
UnsynchedPipe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
~UnsynchedPipe(UnsynchedPipe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *this)

{
  UnsynchedPipe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_local;
  
  (this->
  super_Pipe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>).
  super_AbstractPipe._vptr_AbstractPipe = (_func_int **)&PTR__UnsynchedPipe_001ae520;
  Optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~Optional(&this->m_value);
  Pipe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::~Pipe
            (&this->
              super_Pipe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            );
  return;
}

Assistant:

explicit UnsynchedPipe(AbstractStage* targetStage)
     : m_targetStage(targetStage)
    {
    }